

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brainfck.cpp
# Opt level: O3

void implementations::brainfck::BFFrameDispatcher::dispatch
               (BFFrame *frame,BFArgsSize argsSize,BFArgs *args)

{
  char *pcVar1;
  element_type *peVar2;
  undefined8 *puVar3;
  int iVar4;
  char local_1;
  
  peVar2 = (frame->super_BFStacklessFrame).env.
           super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar4 = (int)(char)(peVar2->code).
                     super__Vector_base<implementations::brainfck::BFOperations,_std::allocator<implementations::brainfck::BFOperations>_>
                     ._M_impl.super__Vector_impl_data._M_start[peVar2->ip];
  peVar2->ip = peVar2->ip + 1;
  if (iVar4 < 0x3c) {
    switch(iVar4) {
    case 0x2b:
      pcVar1 = (peVar2->tape).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + peVar2->mp;
      *pcVar1 = *pcVar1 + '\x01';
      break;
    case 0x2c:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_00130858;
      __cxa_throw(puVar3,&stackless::
                          InvalidOperation<implementations::brainfck::BFOperations,int,unsigned_int>
                          ::typeinfo,std::exception::~exception);
    case 0x2d:
      pcVar1 = (peVar2->tape).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + peVar2->mp;
      *pcVar1 = *pcVar1 + -1;
      break;
    case 0x2e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_1,1);
    }
  }
  else if (iVar4 < 0x5b) {
    if (iVar4 == 0x3c) {
      peVar2->mp = peVar2->mp - 1;
    }
    else if (iVar4 == 0x3e) {
      peVar2->mp = peVar2->mp + 1;
    }
  }
  else {
    if (iVar4 == 0x5b) {
      BFDispatcher<(implementations::brainfck::BFOperations)91>::dispatch(frame,args);
      return;
    }
    if (iVar4 == 0x5d) {
      BFDispatcher<(implementations::brainfck::BFOperations)93>::dispatch(frame,args);
      return;
    }
  }
  return;
}

Assistant:

static void dispatch(BFFrame &frame, BFArgsSize argsSize, BFArgs &args) {
		// Master dispatcher
		const BFOperations operation = frame.fetch();
		
		if(verbose) std::cerr << "Fetch at " << frame.env->ipValue() << " = " << operation << ", mp = " << frame.env->mpValue() << "\n";

		const BFOperations &instruction = frame.fetch();
		++frame.env->ip;

		switch (instruction) {
		case CellRight:
			return BFDispatcher<CellRight>::dispatch(frame, args);
		case CellLeft:
			return BFDispatcher<CellLeft>::dispatch(frame, args);
		case CellIncrement:
			return BFDispatcher<CellIncrement>::dispatch(frame, args);
		case CellDecrement:
			return BFDispatcher<CellDecrement>::dispatch(frame, args);
		case CellWhile:
			return BFDispatcher<CellWhile>::dispatch(frame, args);
		case CellEndWhile:
			return BFDispatcher<CellEndWhile>::dispatch(frame, args);
		case CellPrint:
			return BFDispatcher<CellPrint>::dispatch(frame, args);
		case CellRead:
			return BFDispatcher<CellRead>::dispatch(frame, args);
		default:
			// Do nothing, as per BF rules
			break;
		}
	}